

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float lod;
  float fVar5;
  TexLookupParams *param_1_local;
  ShaderEvalContext *c_local;
  
  pfVar4 = tcu::Vector<float,_4>::z(c->in);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w(c->in);
  fVar1 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::x(c->in);
  fVar2 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w(c->in);
  fVar3 = *pfVar4;
  lod = computeLodFromGrad1D(c);
  fVar5 = texture1DShadow(c,fVar5 / fVar1,fVar2 / fVar3,lod);
  pfVar4 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar4 = fVar5;
  return;
}

Assistant:

static void		evalTexture1DShadowProjGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture1DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), computeLodFromGrad1D(c)); }